

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O0

_Bool effect_handler_RESTORE_MANA(effect_handler_context_t_conflict *context)

{
  wchar_t local_14;
  wchar_t amount;
  effect_handler_context_t_conflict *context_local;
  
  local_14 = effect_calculate_value(context,false);
  if (local_14 == L'\0') {
    local_14 = (wchar_t)player->msp;
  }
  if (player->csp < player->msp) {
    player->csp = player->csp + (short)local_14;
    if (player->msp < player->csp) {
      player->csp = player->msp;
      player->csp_frac = 0;
      msg("You feel your head clear.");
    }
    else {
      msg("You feel your head clear somewhat.");
    }
    player->upkeep->redraw = player->upkeep->redraw | 0x80;
  }
  context->ident = true;
  return true;
}

Assistant:

bool effect_handler_RESTORE_MANA(effect_handler_context_t *context)
{
	int amount = effect_calculate_value(context, false);
	if (!amount) amount = player->msp;
	if (player->csp < player->msp) {
		player->csp += amount;
		if (player->csp > player->msp) {
			player->csp = player->msp;
			player->csp_frac = 0;
			msg("You feel your head clear.");
		} else
			msg("You feel your head clear somewhat.");
		player->upkeep->redraw |= (PR_MANA);
	}
	context->ident = true;

	return true;
}